

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::fixBlockLocations
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TTypeList *typeList,
          bool memberWithLocation,bool memberWithoutLocation)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  int iVar2;
  pointer pTVar3;
  undefined4 extraout_var;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar4;
  
  uVar7 = *(ulong *)&qualifier->field_0x1c;
  uVar5 = (uint)uVar7;
  if ((!memberWithoutLocation || !memberWithLocation) || (~uVar5 & 0xfff) != 0) {
    if (memberWithLocation) {
      uVar6 = 0;
      if ((uVar7 & 0xff000000007fff) != 0xff000000004fff) {
        *(ulong *)&qualifier->field_0x1c = uVar7 | 0xfff;
        if ((uVar5 & 0x7000) != 0x4000) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot apply to a block","component","");
        }
        uVar6 = uVar5 & 0xfff;
        if ((~*(ulong *)&qualifier->field_0x1c & 0xff000000000000) != 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot apply to a block","index","");
        }
      }
      pTVar3 = (typeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl
          .super__Vector_impl_data._M_finish != pTVar3) {
        uVar7 = 0;
        uVar8 = 1;
        do {
          iVar2 = (*(pTVar3[uVar7].type)->_vptr_TType[10])();
          lVar4 = CONCAT44(extraout_var,iVar2);
          if ((~*(uint *)(lVar4 + 0x1c) & 0xfff) == 0) {
            if (0xffe < (int)uVar6) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,&(typeList->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ).
                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar7].loc,
                         "location is too large","location","");
            }
            *(ulong *)(lVar4 + 0x1c) =
                 *(ulong *)(lVar4 + 0x1c) & 0xffffffffffff8000 | (ulong)(uVar6 & 0xfff);
          }
          uVar5 = *(uint *)(lVar4 + 0x1c);
          iVar2 = TIntermediate::computeTypeLocationSize
                            ((typeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ).
                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar7].type,
                             (this->super_TParseContextBase).super_TParseVersions.language);
          uVar6 = iVar2 + (uVar5 & 0xfff);
          pTVar3 = (typeList->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar1 = uVar8 < (ulong)((long)(typeList->
                                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ).
                                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >>
                                 5);
          uVar7 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar1);
      }
    }
    return;
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)
            (this,loc,
             "either the block needs a location, or all members need a location, or no members have a location"
             ,"location","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::fixBlockLocations(const TSourceLoc& loc, TQualifier& qualifier, TTypeList& typeList, bool memberWithLocation, bool memberWithoutLocation)
{
    // "If a block has no block-level location layout qualifier, it is required that either all or none of its members
    // have a location layout qualifier, or a compile-time error results."
    if (! qualifier.hasLocation() && memberWithLocation && memberWithoutLocation)
        error(loc, "either the block needs a location, or all members need a location, or no members have a location", "location", "");
    else {
        if (memberWithLocation) {
            // remove any block-level location and make it per *every* member
            int nextLocation = 0;  // by the rule above, initial value is not relevant
            if (qualifier.hasAnyLocation()) {
                nextLocation = qualifier.layoutLocation;
                qualifier.layoutLocation = TQualifier::layoutLocationEnd;
                if (qualifier.hasComponent()) {
                    // "It is a compile-time error to apply the *component* qualifier to a ... block"
                    error(loc, "cannot apply to a block", "component", "");
                }
                if (qualifier.hasIndex()) {
                    error(loc, "cannot apply to a block", "index", "");
                }
            }
            for (unsigned int member = 0; member < typeList.size(); ++member) {
                TQualifier& memberQualifier = typeList[member].type->getQualifier();
                const TSourceLoc& memberLoc = typeList[member].loc;
                if (! memberQualifier.hasLocation()) {
                    if (nextLocation >= (int)TQualifier::layoutLocationEnd)
                        error(memberLoc, "location is too large", "location", "");
                    memberQualifier.layoutLocation = nextLocation;
                    memberQualifier.layoutComponent = 0;
                }
                nextLocation = memberQualifier.layoutLocation +
                               intermediate.computeTypeLocationSize(*typeList[member].type, language);
            }
        }
    }
}